

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibustypes.cpp
# Opt level: O3

QTextCharFormat * __thiscall
QIBusAttribute::format(QTextCharFormat *__return_storage_ptr__,QIBusAttribute *this)

{
  Type TVar1;
  QVariant *pQVar2;
  UnderlineStyle UVar3;
  long in_FS_OFFSET;
  QBrush aQStack_58 [8];
  QColor local_50;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)__return_storage_ptr__ = 0xaaaaaaaaaaaaaaaa;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = 0xaaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat(__return_storage_ptr__);
  TVar1 = this->type;
  UVar3 = (UnderlineStyle)__return_storage_ptr__;
  if (TVar1 == Background) {
    QColor::QColor(&local_50,this->value);
    QBrush::QBrush(aQStack_58,&local_50,SolidPattern);
    QBrush::operator_cast_to_QVariant(&local_40,aQStack_58);
    pQVar2 = (QVariant *)0x820;
  }
  else {
    if (TVar1 != Foreground) {
      if (TVar1 == Underline) {
        switch(this->value) {
        case 3:
          break;
        case 4:
          QColor::QColor(&local_50,red);
          QColor::operator_cast_to_QVariant(&local_40,&local_50);
          QTextFormat::setProperty(UVar3,(QVariant *)0x2020);
          QVariant::~QVariant(&local_40);
        }
        QTextCharFormat::setUnderlineStyle(UVar3);
      }
      goto LAB_0011b267;
    }
    QColor::QColor(&local_50,this->value);
    QBrush::QBrush(aQStack_58,&local_50,SolidPattern);
    QBrush::operator_cast_to_QVariant(&local_40,aQStack_58);
    pQVar2 = (QVariant *)0x821;
  }
  QTextFormat::setProperty(UVar3,pQVar2);
  QVariant::~QVariant(&local_40);
  QBrush::~QBrush(aQStack_58);
LAB_0011b267:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTextCharFormat QIBusAttribute::format() const
{
    QTextCharFormat fmt;
    switch (type) {
    case Invalid:
        break;
    case Underline: {
        QTextCharFormat::UnderlineStyle style = QTextCharFormat::NoUnderline;

        switch (value) {
        case UnderlineNone:
            break;
        case UnderlineSingle:
            style = QTextCharFormat::SingleUnderline;
            break;
        case UnderlineDouble:
            style = QTextCharFormat::DashUnderline;
            break;
        case UnderlineLow:
            style = QTextCharFormat::DashDotLine;
            break;
        case UnderlineError:
            style = QTextCharFormat::WaveUnderline;
            fmt.setUnderlineColor(Qt::red);
            break;
        }

        fmt.setUnderlineStyle(style);
        break;
    }
    case Foreground:
        fmt.setForeground(QColor(value));
        break;
    case Background:
        fmt.setBackground(QColor(value));
        break;
    }
    return fmt;
}